

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O3

void __thiscall
ear::GainCalculatorHOAImpl::GainCalculatorHOAImpl(GainCalculatorHOAImpl *this,Layout *layout)

{
  undefined8 *puVar1;
  bool *__ptr;
  double *pdVar2;
  size_type sVar3;
  undefined8 uVar4;
  Index IVar5;
  Index IVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var7;
  bool *pbVar8;
  undefined8 *puVar9;
  Index i;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  shared_ptr<ear::PointSourcePanner> panner;
  DenseStorage<double,__1,__1,__1,_0> local_f8;
  DenseStorage<double,__1,__1,_3,_0> local_e0;
  char local_d0 [8];
  void *local_c8;
  ulong local_c0;
  undefined8 *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  Layout local_a8;
  
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (bool *)0x0;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows = 0
  ;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  Layout::withoutLfe(&local_a8,layout);
  configurePolarPanner((ear *)&local_b8,&local_a8);
  if (local_a8._screen.super_type.m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &local_a8._screen.super_type.m_storage);
    local_a8._screen.super_type.m_initialized = false;
  }
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_a8._channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._name._M_dataplus._M_p != &local_a8._name.field_2) {
    operator_delete(local_a8._name._M_dataplus._M_p,local_a8._name.field_2._M_allocated_capacity + 1
                   );
  }
  Layout::isLfe((vector<bool,_std::allocator<bool>_> *)&local_a8,layout);
  _Var7._M_p = local_a8._name._M_dataplus._M_p;
  uVar13 = (local_a8._name.field_2._M_allocated_capacity - (long)local_a8._name._M_dataplus._M_p) *
           8 + (ulong)(uint)local_a8._name.field_2._8_4_;
  if ((long)uVar13 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Array<bool, -1, 1>>::resize(Index) [Derived = Eigen::Array<bool, -1, 1>]"
                 );
  }
  if (uVar13 == 0) {
    pbVar8 = (bool *)0x0;
  }
  else {
    pbVar8 = (bool *)malloc(uVar13);
    if (0xf < uVar13 && ((ulong)pbVar8 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                    ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pbVar8 == (bool *)0x0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = std::random_device::_M_fini;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar10 = 0;
    do {
      pbVar8[uVar10] = (*(ulong *)(_Var7._M_p + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0;
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar13);
  }
  __ptr = (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       pbVar8;
  (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       uVar13;
  free(__ptr);
  if ((double *)local_a8._name._M_dataplus._M_p != (double *)0x0) {
    operator_delete(local_a8._name._M_dataplus._M_p,
                    (long)local_a8._channels.
                          super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)local_a8._name._M_dataplus._M_p);
  }
  hoa::load_points();
  pdVar2 = (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
           m_data;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)local_a8._name._M_dataplus._M_p;
  sVar3 = (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows =
       local_a8._name._M_string_length;
  local_a8._name._M_dataplus._M_p = (pointer)pdVar2;
  local_a8._name._M_string_length = sVar3;
  free(pdVar2);
  Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
            (&local_e0,(DenseStorage<double,__1,__1,_3,_0> *)this);
  this_00 = local_b0;
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b0->_M_use_count = local_b0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b0->_M_use_count = local_b0->_M_use_count + 1;
    }
  }
  local_a8._name._M_dataplus._M_p = (pointer)0x0;
  local_a8._name._M_string_length = 0x3ff0000000000000;
  local_a8._name.field_2._M_allocated_capacity = 0;
  (**(code **)*local_b8)(local_d0,local_b8);
  uVar13 = local_c0;
  if (local_d0[0] == '\0') {
LAB_00139eb6:
    __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                  "reference_type boost::optional<Eigen::Matrix<double, -1, 1>>::get() [T = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  free(local_c8);
  local_f8.m_data = (double *)0x0;
  local_f8.m_rows = 0;
  local_f8.m_cols = 0;
  if ((long)(local_e0.m_rows | uVar13) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((local_e0.m_rows != 0 && uVar13 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_e0.m_rows),0) <
      (long)uVar13)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = std::random_device::_M_fini;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_f8,local_e0.m_rows * uVar13,uVar13,local_e0.m_rows);
  if (0 < local_e0.m_rows) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      local_a8._name._M_dataplus._M_p = (pointer)local_e0.m_data[lVar14];
      local_a8._name._M_string_length = (size_type)local_e0.m_data[lVar14 + local_e0.m_rows];
      local_a8._name.field_2._M_allocated_capacity =
           (size_type)local_e0.m_data[lVar14 + local_e0.m_rows * 2];
      (**(code **)*local_b8)(local_d0,local_b8,&local_a8);
      if (local_d0[0] == '\0') goto LAB_00139eb6;
      if (local_f8.m_rows < 0 && local_f8.m_data != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (local_f8.m_cols <= lVar14) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if (local_f8.m_rows != local_c0) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                      ,0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
                     );
      }
      uVar13 = local_f8.m_rows;
      if ((((ulong)(local_f8.m_data + local_f8.m_rows * lVar14) & 7) == 0) &&
         (uVar13 = (ulong)((uint)((ulong)(local_f8.m_data + local_f8.m_rows * lVar14) >> 3) & 1),
         local_f8.m_rows <= (long)uVar13)) {
        uVar13 = local_f8.m_rows;
      }
      if (0 < (long)uVar13) {
        uVar10 = 0;
        do {
          *(undefined8 *)((long)local_f8.m_data + uVar10 * 8 + local_f8.m_rows * lVar11) =
               *(undefined8 *)((long)local_c8 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
      lVar12 = local_f8.m_rows - uVar13;
      uVar10 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
      if (1 < lVar12) {
        do {
          puVar9 = (undefined8 *)((long)local_c8 + uVar13 * 8);
          uVar4 = puVar9[1];
          puVar1 = (undefined8 *)((long)local_f8.m_data + uVar13 * 8 + local_f8.m_rows * lVar11);
          *puVar1 = *puVar9;
          puVar1[1] = uVar4;
          uVar13 = uVar13 + 2;
        } while ((long)uVar13 < (long)uVar10);
      }
      if ((long)uVar10 < local_f8.m_rows) {
        do {
          *(undefined8 *)((long)local_f8.m_data + uVar10 * 8 + local_f8.m_rows * lVar11) =
               *(undefined8 *)((long)local_c8 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (local_f8.m_rows != uVar10);
      }
      if (local_d0[0] == '\x01') {
        free(local_c8);
      }
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar14 < local_e0.m_rows);
  }
  pdVar2 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_f8.m_data;
  IVar5 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar6 = (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_f8.m_rows;
  (this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_f8.m_cols;
  local_f8.m_data = pdVar2;
  local_f8.m_rows = IVar5;
  local_f8.m_cols = IVar6;
  free(pdVar2);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  free(local_e0.m_data);
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  return;
}

Assistant:

GainCalculatorHOAImpl::GainCalculatorHOAImpl(const Layout &layout) {
    std::shared_ptr<PointSourcePanner> panner =
        configurePolarPanner(layout.withoutLfe());
    is_lfe = copy_vector<decltype(is_lfe)>(layout.isLfe());
    points = hoa::load_points();
    G_virt = hoa::calc_G_virt(
        points, [panner](Eigen::Vector3d pos) { return panner->handle(pos); });
  }